

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O2

bool __thiscall
FileTokenizer::convertFloat(FileTokenizer *this,size_t start,size_t end,double *result)

{
  double dVar1;
  char *end_ptr;
  string str;
  char *local_40;
  char *local_38;
  long local_30;
  
  std::__cxx11::string::substr((ulong)&local_38,(ulong)&this->currentLine);
  dVar1 = strtod(local_38,&local_40);
  *result = dVar1;
  std::__cxx11::string::~string((string *)&local_38);
  return local_38 + local_30 == local_40;
}

Assistant:

bool FileTokenizer::convertFloat(size_t start, size_t end, double& result)
{
	std::string str = currentLine.substr(start, end - start);
	char* end_ptr;

	result = strtod(str.c_str(), &end_ptr);
	return str.c_str() + str.size() == end_ptr;
}